

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O2

void FunctionDef::accessToJson(QJsonObject *obj,Access acs)

{
  char *pcVar1;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView key;
  qsizetype qStack_50;
  QJsonValueConstRef local_48;
  QJsonValue local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (acs == Public) {
    s_00.m_size = 6;
    s_00.m_data = "public";
    QJsonValue::QJsonValue(&local_38,s_00);
  }
  else {
    if (acs == Protected) {
      pcVar1 = "protected";
      qStack_50 = 9;
    }
    else {
      if (acs != Private) goto LAB_001261c7;
      pcVar1 = "private";
      qStack_50 = 7;
    }
    s.m_size = qStack_50;
    s.m_data = pcVar1;
    QJsonValue::QJsonValue(&local_38,s);
  }
  key.m_size = 6;
  key.m_data = "access";
  local_48 = (QJsonValueConstRef)QJsonObject::operator[](obj,key);
  QJsonValueRef::operator=((QJsonValueRef *)&local_48,&local_38);
  QJsonValue::~QJsonValue(&local_38);
LAB_001261c7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void FunctionDef::accessToJson(QJsonObject *obj, FunctionDef::Access acs)
{
    switch (acs) {
    case Private: (*obj)["access"_L1] = "private"_L1; break;
    case Public: (*obj)["access"_L1] = "public"_L1; break;
    case Protected: (*obj)["access"_L1] = "protected"_L1; break;
    }
}